

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O0

void fiobj_data_assert_dynamic(FIOBJ io)

{
  fiobj_type_enum fVar1;
  int *piVar2;
  FIOBJ io_local;
  
  if (io == 0) {
    piVar2 = __errno_location();
    *piVar2 = 0x17;
  }
  else {
    fVar1 = fiobj_type(io);
    if (fVar1 != FIOBJ_T_DATA) {
      __assert_fail("FIOBJ_TYPE(io) == FIOBJ_T_DATA",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_data.c"
                    ,0x3ad,"void fiobj_data_assert_dynamic(FIOBJ)");
    }
    fiobj_data_pre_write(io,0);
  }
  return;
}

Assistant:

void fiobj_data_assert_dynamic(FIOBJ io) {
  if (!io) {
    errno = ENFILE;
    return;
  }
  assert(FIOBJ_TYPE(io) == FIOBJ_T_DATA);
  fiobj_data_pre_write(io, 0);
  return;
}